

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Arguments.cpp
# Opt level: O0

Arguments * __thiscall
Corrade::Utility::Arguments::setHelp(Arguments *this,string *key,string *help,string *helpKey)

{
  Entry *pEVar1;
  ostream *poVar2;
  Debug *pDVar3;
  ulong uVar4;
  Flags local_149;
  Error local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  Flags local_b9;
  Error local_b8;
  Flags local_89;
  Error local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  Entry *local_30;
  Entry *found;
  string *helpKey_local;
  string *help_local;
  string *key_local;
  Arguments *this_local;
  
  found = (Entry *)helpKey;
  helpKey_local = help;
  help_local = key;
  key_local = (string *)this;
  std::operator+(&local_50,&this->_prefix,key);
  pEVar1 = find(this,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  local_30 = pEVar1;
  if (pEVar1 == (Entry *)0x0) {
    poVar2 = Error::defaultOutput();
    Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_89);
    Error::Error(&local_88,poVar2,local_89);
    pDVar3 = Debug::operator<<(&local_88.super_Debug,"Utility::Arguments::setHelp(): key");
    pDVar3 = operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                       (pDVar3,help_local);
    Debug::operator<<(pDVar3,"not found");
    Error::~Error(&local_88);
    abort();
  }
  std::__cxx11::string::operator=((string *)&pEVar1->help,(string *)help);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    if (local_30->type == BooleanOption) {
      poVar2 = Error::defaultOutput();
      Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet(&local_b9);
      Error::Error(&local_b8,poVar2,local_b9);
      pDVar3 = Debug::operator<<(&local_b8.super_Debug,
                                 "Utility::Arguments::setHelp(): help key can\'t be set for boolean option"
                                );
      operator<<<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                (pDVar3,help_local);
      Error::~Error(&local_b8);
      abort();
    }
    if (((local_30->type == NamedArgument) || (local_30->type == Option)) ||
       (local_30->type == ArrayOption)) {
      std::operator+(&local_120,&this->_prefix,help_local);
      std::operator+(&local_100,&local_120,' ');
      std::operator+(&local_e0,&local_100,helpKey);
      std::__cxx11::string::operator=((string *)&local_30->helpKey,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_120);
    }
    else {
      if ((local_30->type != Argument) && (local_30->type != ArrayArgument)) {
        poVar2 = Error::defaultOutput();
        Containers::EnumSet<Corrade::Utility::Debug::Flag,_(unsigned_char)'\xff'>::EnumSet
                  (&local_149);
        Error::Error(&local_148,poVar2,local_149);
        Debug::operator<<(&local_148.super_Debug,
                          "Assertion found->type == Type::Argument || found->type == Type::ArrayArgument failed at /workspace/llm4binary/github/license_c_cmakelists/mosra[P]corrade/src/Corrade/Utility/Arguments.cpp:468"
                         );
        Error::~Error(&local_148);
        abort();
      }
      std::__cxx11::string::operator=((string *)&local_30->helpKey,(string *)helpKey);
    }
  }
  return this;
}

Assistant:

Arguments& Arguments::setHelp(const std::string& key, std::string help, std::string helpKey) {
    Entry* found = find(_prefix + key);
    CORRADE_ASSERT(found, "Utility::Arguments::setHelp(): key" << key << "not found", *this);

    found->help = std::move(help);

    if(!helpKey.empty()) {
        CORRADE_ASSERT(found->type != Type::BooleanOption,
            "Utility::Arguments::setHelp(): help key can't be set for boolean option" << key, *this);

        if(found->type == Type::NamedArgument || found->type == Type::Option || found->type == Type::ArrayOption)
            found->helpKey = _prefix + key + ' ' + std::move(helpKey);
        else {
            CORRADE_INTERNAL_ASSERT(found->type == Type::Argument || found->type == Type::ArrayArgument);
            found->helpKey = std::move(helpKey);
        }
    }

    return *this;
}